

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysy_bridge.cpp
# Opt level: O1

shared_ptr<ast_compunit> read_source_ast(char *fname)

{
  int iVar1;
  undefined8 extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  char *in_RSI;
  shared_ptr<ast_compunit> sVar3;
  
  yyin = (FILE *)fopen(in_RSI,"r");
  if ((FILE *)yyin != (FILE *)0x0) {
    fname[0] = '\0';
    fname[1] = '\0';
    fname[2] = '\0';
    fname[3] = '\0';
    fname[4] = '\0';
    fname[5] = '\0';
    fname[6] = '\0';
    fname[7] = '\0';
    fname[8] = '\0';
    fname[9] = '\0';
    fname[10] = '\0';
    fname[0xb] = '\0';
    fname[0xc] = '\0';
    fname[0xd] = '\0';
    fname[0xe] = '\0';
    fname[0xf] = '\0';
    iVar1 = yyparse((shared_ptr<ast_compunit> *)fname);
    fclose((FILE *)yyin);
    _Var2._M_pi = extraout_RDX;
    if (iVar1 != 0) {
      perror("Syntax error returned from yyparse().");
      _Var2._M_pi = extraout_RDX_00;
    }
    sVar3.super___shared_ptr<ast_compunit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    sVar3.super___shared_ptr<ast_compunit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)fname;
    return (shared_ptr<ast_compunit>)
           sVar3.super___shared_ptr<ast_compunit,_(__gnu_cxx::_Lock_policy)2>;
  }
  read_source_ast();
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(fname + 8) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(fname + 8));
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::shared_ptr<ast_compunit> read_source_ast(const char *fname) {
  yyin = fopen(fname, "r");
  if(!yyin) {
    perror("Error opening source file");
    exit(1);
  }
  std::shared_ptr<ast_compunit> ret;
  int status = yyparse(ret);
  fclose(yyin);
  if(status) {
    perror("Syntax error returned from yyparse().");
  }
  return ret;
}